

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-priority.c
# Opt level: O0

int run_test_process_priority(void)

{
  int iVar1;
  uv_pid_t pid;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int local_18;
  int i;
  int r;
  int priority;
  
  local_18 = uv_os_getpriority(0,(int *)0x0);
  if ((long)local_18 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
            ,0x26,"r","==","UV_EINVAL",(long)local_18,"==",0xffffffffffffffea);
    abort();
  }
  eval_a._4_4_ = -0x14;
  do {
    if (0x13 < eval_a._4_4_) {
      iVar1 = uv_os_setpriority(0,-0x15);
      if ((long)iVar1 != -0x16) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
                ,0x4f,"uv_os_setpriority(0, -20 - 1)","==","UV_EINVAL",(long)iVar1,"==",
                0xffffffffffffffea);
        abort();
      }
      iVar1 = uv_os_setpriority(0,0x14);
      if ((long)iVar1 == -0x16) {
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
              ,0x50,"uv_os_setpriority(0, 19 + 1)","==","UV_EINVAL",(long)iVar1,"==",
              0xffffffffffffffea);
      abort();
    }
    local_18 = uv_os_setpriority(0,eval_a._4_4_);
    if (local_18 != -0xd) {
      if ((long)local_18 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
                ,0x31,"r","==","0",(long)local_18,"==",0);
        abort();
      }
      iVar1 = uv_os_getpriority(0,&i);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
                ,0x32,"uv_os_getpriority(0, &priority)","==","0",(long)iVar1,"==",0);
        abort();
      }
      if ((long)i != (long)eval_a._4_4_) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
                ,0x37,"priority","==","i",(long)i,"==",(long)eval_a._4_4_);
        abort();
      }
      pid = uv_os_getpid();
      iVar1 = uv_os_getpriority(pid,&local_18);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
                ,0x4a,"uv_os_getpriority(uv_os_getpid(), &r)","==","0",(long)iVar1,"==",0);
        abort();
      }
      if ((long)i != (long)local_18) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
                ,0x4b,"priority","==","r",(long)i,"==",(long)local_18);
        abort();
      }
    }
    eval_a._4_4_ = eval_a._4_4_ + 1;
  } while( true );
}

Assistant:

TEST_IMPL(process_priority) {
  int priority;
  int r;
  int i;

#if defined(__MVS__)
  if (uv_os_setpriority(0, 0) == UV_ENOSYS)
    RETURN_SKIP("functionality not supported on zOS");
#endif

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  r = uv_os_getpriority(0, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  /* Verify that all valid values work. */
  for (i = UV_PRIORITY_HIGHEST; i <= UV_PRIORITY_LOW; i++) {
    r = uv_os_setpriority(0, i);

    /* If UV_EACCES is returned, the current user doesn't have permission to
       set this specific priority. */
    if (r == UV_EACCES)
      continue;

    ASSERT_OK(r);
    ASSERT_OK(uv_os_getpriority(0, &priority));

    /* Verify that the priority values match on Unix, and are range mapped
       on Windows. */
#ifndef _WIN32
    ASSERT_EQ(priority, i);
#else
    /* On Windows, only elevated users can set UV_PRIORITY_HIGHEST. Other
       users will silently be set to UV_PRIORITY_HIGH. */
    if (i < UV_PRIORITY_HIGH)
      ASSERT(priority == UV_PRIORITY_HIGHEST || priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_ABOVE_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_ABOVE_NORMAL);
    else if (i < UV_PRIORITY_BELOW_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_NORMAL);
    else if (i < UV_PRIORITY_LOW)
      ASSERT_EQ(priority, UV_PRIORITY_BELOW_NORMAL);
    else
      ASSERT_EQ(priority, UV_PRIORITY_LOW);
#endif

    /* Verify that the current PID and 0 are equivalent. */
    ASSERT_OK(uv_os_getpriority(uv_os_getpid(), &r));
    ASSERT_EQ(priority, r);
  }

  /* Verify that invalid priorities return UV_EINVAL. */
  ASSERT_EQ(uv_os_setpriority(0, UV_PRIORITY_HIGHEST - 1), UV_EINVAL);
  ASSERT_EQ(uv_os_setpriority(0, UV_PRIORITY_LOW + 1), UV_EINVAL);

  return 0;
}